

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O0

MESSAGE_SEND_CONTEXT * create_message_send_context(void)

{
  MESSAGE_SEND_CONTEXT *__s;
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  MESSAGE_SEND_CONTEXT *result;
  
  __s = (MESSAGE_SEND_CONTEXT *)malloc(0x38);
  if (__s == (MESSAGE_SEND_CONTEXT *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"create_message_send_context",0x73,1,"Failed creating the message send context");
    }
  }
  else {
    memset(__s,0,0x38);
  }
  return __s;
}

Assistant:

static MESSAGE_SEND_CONTEXT* create_message_send_context(void)
{
    MESSAGE_SEND_CONTEXT* result;

    if ((result = (MESSAGE_SEND_CONTEXT*)malloc(sizeof(MESSAGE_SEND_CONTEXT))) == NULL)
    {
        LogError("Failed creating the message send context");
    }
    else
    {
        memset(result, 0, sizeof(MESSAGE_SEND_CONTEXT));
    }

    return result;
}